

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear.h
# Opt level: O3

void __thiscall
ncnn::linear_coeffs(ncnn *this,int w,int outw,int *xofs,float *alpha,int align_corner)

{
  undefined4 in_register_00000014;
  int iVar1;
  ulong uVar2;
  int iVar3;
  undefined8 in_XMM0_Qa;
  undefined1 auVar4 [16];
  double dVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  iVar1 = (int)this;
  if ((int)alpha == 0) {
    dVar5 = (double)w;
    iVar3 = iVar1;
  }
  else {
    dVar5 = (double)(w + -1);
    iVar3 = iVar1 + -1;
  }
  auVar4._0_8_ = (double)iVar3 / dVar5;
  auVar4._8_8_ = in_XMM0_Qa;
  if (0 < w) {
    uVar2 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (double)(int)uVar2 + 0.5;
      auVar8 = vfmadd213sd_fma(auVar7,auVar4,ZEXT816(0xbfe0000000000000));
      if ((int)alpha != 0) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auVar4._0_8_ * (double)(int)uVar2;
      }
      auVar9._0_4_ = (float)auVar8._0_8_;
      auVar9._4_12_ = auVar8._4_12_;
      auVar8 = vroundss_avx(auVar9,auVar9,9);
      iVar3 = (int)auVar8._0_4_;
      fVar6 = 0.0;
      if (-1 < iVar3) {
        fVar6 = auVar9._0_4_ - auVar8._0_4_;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      if (iVar1 + -1 <= iVar3) {
        iVar3 = iVar1 + -2;
        fVar6 = 1.0;
      }
      *(int *)(CONCAT44(in_register_00000014,outw) + uVar2 * 4) = iVar3;
      xofs[uVar2 * 2] = (int)(1.0 - fVar6);
      xofs[uVar2 * 2 + 1] = (int)fVar6;
      uVar2 = uVar2 + 1;
    } while ((uint)w != uVar2);
  }
  return;
}

Assistant:

static void linear_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = (float)(dx * scale);
        }

        int sx = (int)floorf(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx * 2] = 1.f - fx;
        alpha[dx * 2 + 1] = fx;
    }
}